

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O1

int yang_read_default(lys_module *module,void *node,char *value,yytokentype type)

{
  int iVar1;
  char *where;
  char **target;
  
  if (type == TYPEDEF_KEYWORD) {
    target = (char **)((long)node + 0x78);
    where = "typedef";
    node = (lys_node *)0x0;
  }
  else {
    if (type != LEAF_KEYWORD) {
      free(value);
      ly_log(module->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser_yang.c"
             ,0x1af);
      return 1;
    }
    target = (char **)((long)node + 200);
    where = "leaf";
  }
  iVar1 = yang_check_string(module,target,"default",where,value,(lys_node *)node);
  return iVar1;
}

Assistant:

int
yang_read_default(struct lys_module *module, void *node, char *value, enum yytokentype type)
{
    int ret;

    switch (type) {
    case LEAF_KEYWORD:
        ret = yang_check_string(module, &((struct lys_node_leaf *) node)->dflt, "default", "leaf", value, node);
        break;
    case TYPEDEF_KEYWORD:
        ret = yang_check_string(module, &((struct lys_tpdf *) node)->dflt, "default", "typedef", value, NULL);
        break;
    default:
        free(value);
        LOGINT(module->ctx);
        ret = EXIT_FAILURE;
        break;
    }
    return ret;
}